

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_file_reader_skip(mpack_reader_t *reader,size_t count)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  
  if (reader->error == mpack_ok) {
    __stream = (FILE *)reader->context;
    lVar2 = ftell(__stream);
    if (lVar2 < 0) {
LAB_00106e3f:
      mpack_reader_skip_using_fill(reader,count);
      return;
    }
    iVar1 = fseek(__stream,count,1);
    if (iVar1 != 0) {
      iVar1 = ferror(__stream);
      if (iVar1 == 0) goto LAB_00106e3f;
      if (reader->error == mpack_ok) {
        reader->error = mpack_error_io;
        reader->end = reader->data;
        if (reader->error_fn != (mpack_reader_error_t)0x0) {
          (*reader->error_fn)(reader,mpack_error_io);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void mpack_file_reader_skip(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return;
    FILE* file = (FILE*)reader->context;

    // We call ftell() to test whether the stream is seekable
    // without causing a file error.
    if (ftell(file) >= 0) {
        mpack_log("seeking forward %i bytes\n", (int)count);
        if (fseek(file, (long int)count, SEEK_CUR) == 0)
            return;
        mpack_log("fseek() didn't return zero!\n");
        if (ferror(file)) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return;
        }
    }

    // If the stream is not seekable, fall back to the fill function.
    mpack_reader_skip_using_fill(reader, count);
}